

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall CGL::ImageBuffer::update_pixel(ImageBuffer *this,Color *c,size_t x,size_t y)

{
  reference pvVar1;
  ulong in_RCX;
  ulong in_RDX;
  ulong *in_RDI;
  float fVar2;
  float fVar3;
  uint32_t p;
  float fVar4;
  float lo;
  float in_stack_ffffffffffffffc4;
  float x_00;
  
  if (*in_RDI <= in_RDX) {
    __assert_fail("0 <= x && x < w",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/util/image.h"
                  ,0x36,"void CGL::ImageBuffer::update_pixel(const Color &, size_t, size_t)");
  }
  if (in_RCX < in_RDI[1]) {
    lo = 0.0;
    fVar4 = 1.0;
    fVar2 = clamp<float>(in_stack_ffffffffffffffc4,0.0,1.0);
    x_00 = 255.0;
    fVar3 = clamp<float>(255.0,lo,fVar4);
    fVar3 = fVar3 * x_00;
    fVar4 = clamp<float>(x_00,lo,fVar4);
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                        in_RDX + in_RCX * *in_RDI);
    *pvVar1 = (uint)(long)(fVar4 * x_00) |
              (int)(long)(fVar2 * 255.0) << 0x10 | (int)(long)fVar3 << 8 | 0xff000000;
    return;
  }
  __assert_fail("0 <= y && y < h",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/util/image.h"
                ,0x37,"void CGL::ImageBuffer::update_pixel(const Color &, size_t, size_t)");
}

Assistant:

void update_pixel(const Color& c, size_t x, size_t y) {
    assert(0 <= x && x < w);
    assert(0 <= y && y < h);
    uint32_t p = 0;
    p |= ((uint32_t) (clamp(0.f, 1.f, c.b) * 255)) << 16;
    p |= ((uint32_t) (clamp(0.f, 1.f, c.g) * 255)) << 8;
    p |= ((uint32_t) (clamp(0.f, 1.f, c.r) * 255));
    p |= 0xFF000000;
    data[x + y * w] = p;
  }